

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O0

Vec_Int_t * Gia_ManFindLatest(Gia_Man_t *p,int LevelMax,int nTimeWindow)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  void *__ptr;
  int *piVar3;
  bool bVar4;
  int local_44;
  int nLevels_1;
  int i_1;
  int *pLevels;
  int nLevels;
  int iFan;
  int k;
  int i;
  Vec_Int_t *vOuts;
  Gia_Obj_t *pObj;
  int nTimeWindow_local;
  int LevelMax_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManHasMapping(p);
  pObj._4_4_ = LevelMax;
  if (iVar1 == 0) {
    uVar2 = Gia_ManLevelNum(p);
    if (nTimeWindow != 0) {
      pObj._4_4_ = (uint)(((double)nTimeWindow * -0.01 + 1.0) * (double)(int)uVar2);
    }
    if ((int)uVar2 < (int)pObj._4_4_) {
      printf("The maximum AIG level (%d) is less than the target level (%d).\n",(ulong)uVar2,
             (ulong)pObj._4_4_);
    }
    local_44 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar4 = false;
      if (local_44 < iVar1) {
        vOuts = (Vec_Int_t *)Gia_ManCo(p,local_44);
        bVar4 = vOuts != (Vec_Int_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjLevel(p,(Gia_Obj_t *)vOuts);
      if ((int)pObj._4_4_ <= iVar1) {
        Vec_IntPush(p_00,local_44);
      }
      local_44 = local_44 + 1;
    }
  }
  else {
    pLevels._0_4_ = 0;
    iVar1 = Gia_ManObjNum(p);
    __ptr = calloc((long)iVar1,4);
    for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
      iVar1 = Gia_ObjIsLut(p,iFan);
      if (iVar1 != 0) {
        for (nLevels = 0; iVar1 = Gia_ObjLutSize(p,iFan), nLevels < iVar1; nLevels = nLevels + 1) {
          piVar3 = Gia_ObjLutFanins(p,iFan);
          iVar1 = Abc_MaxInt(*(int *)((long)__ptr + (long)iFan * 4),
                             *(int *)((long)__ptr + (long)piVar3[nLevels] * 4));
          *(int *)((long)__ptr + (long)iFan * 4) = iVar1;
        }
        *(int *)((long)__ptr + (long)iFan * 4) = *(int *)((long)__ptr + (long)iFan * 4) + 1;
        pLevels._0_4_ = Abc_MaxInt((uint)pLevels,*(int *)((long)__ptr + (long)iFan * 4));
      }
    }
    if (nTimeWindow != 0) {
      pObj._4_4_ = (uint)(((double)nTimeWindow * -0.01 + 1.0) * (double)(int)(uint)pLevels);
    }
    if ((int)(uint)pLevels < (int)pObj._4_4_) {
      printf("The maximum mapped level (%d) is less than the target level (%d).\n",
             (ulong)(uint)pLevels,(ulong)pObj._4_4_);
    }
    iFan = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar4 = false;
      if (iFan < iVar1) {
        vOuts = (Vec_Int_t *)Gia_ManCo(p,iFan);
        bVar4 = vOuts != (Vec_Int_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjFaninId0p(p,(Gia_Obj_t *)vOuts);
      if ((int)pObj._4_4_ <= *(int *)((long)__ptr + (long)iVar1 * 4)) {
        Vec_IntPush(p_00,iFan);
      }
      iFan = iFan + 1;
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManFindLatest( Gia_Man_t * p, int LevelMax, int nTimeWindow )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vOuts;
    vOuts = Vec_IntAlloc( 1000 );
    if ( Gia_ManHasMapping(p) )
    {
        int i, k, iFan, nLevels = 0;
        int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
        Gia_ManForEachLut( p, i )
        {
            Gia_LutForEachFanin( p, i, iFan, k )
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[iFan] );
            pLevels[i]++;
            nLevels = Abc_MaxInt( nLevels, pLevels[i] );
        }
        if ( nTimeWindow )
            LevelMax = (int)((1.0 - 0.01 * nTimeWindow) * nLevels);
        if ( nLevels < LevelMax )
            printf( "The maximum mapped level (%d) is less than the target level (%d).\n", nLevels, LevelMax );
        Gia_ManForEachCo( p, pObj, i )
            if ( pLevels[Gia_ObjFaninId0p(p, pObj)] >= LevelMax )
                Vec_IntPush( vOuts, i );
        ABC_FREE( pLevels );
    }
    else
    {
        int i, nLevels = Gia_ManLevelNum( p );
        if ( nTimeWindow )
            LevelMax = (int)((1.0 - 0.01 * nTimeWindow) * nLevels);
        if ( nLevels < LevelMax )
            printf( "The maximum AIG level (%d) is less than the target level (%d).\n", nLevels, LevelMax );
        Gia_ManForEachCo( p, pObj, i )
            if ( Gia_ObjLevel(p, pObj) >= LevelMax )
                Vec_IntPush( vOuts, i );
    }
    return vOuts;
}